

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O0

monster_group_conflict * summon_group(chunk *c,wchar_t midx)

{
  monster *mon_00;
  wchar_t local_2c;
  wchar_t index;
  monster *mon;
  wchar_t midx_local;
  chunk *c_local;
  
  mon_00 = (monster *)cave_monster((chunk_conflict *)c,midx);
  if (mon_00 == (monster *)0x0) {
    c_local = (chunk *)0x0;
  }
  else {
    if (mon_00->group_info[0].role == MON_GROUP_LEADER) {
      local_2c = mon_00->group_info[0].index;
    }
    else {
      local_2c = mon_00->group_info[1].index;
      if (local_2c == L'\0') {
        monster_group_start(c,mon_00,L'\x01');
        local_2c = mon_00->group_info[1].index;
      }
    }
    c_local = (chunk *)monster_group_by_index(c,local_2c);
  }
  return (monster_group_conflict *)c_local;
}

Assistant:

struct monster_group *summon_group(struct chunk *c, int midx)
{
	struct monster *mon = cave_monster(c, midx);
	int index;

	if (!mon) return NULL;

	/* If the monster is leader of its primary group, return that group */
	if (mon->group_info[PRIMARY_GROUP].role == MON_GROUP_LEADER) {
		index = mon->group_info[PRIMARY_GROUP].index;
	} else {
		/* Get the (distinct) summon group */
		index = mon->group_info[SUMMON_GROUP].index;

		/* Make a group if there isn't one already */
		if (!index) {
			monster_group_start(c, mon, 1);
			index = mon->group_info[SUMMON_GROUP].index;
		}
	}

	return monster_group_by_index(c, index);
}